

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

bool rsg::AtanOp::transformValueRange(float outMin,float outMax,float *inMin,float *inMax)

{
  float fVar1;
  float rangeMax;
  float rangeMin;
  float *inMax_local;
  float *inMin_local;
  float outMax_local;
  float outMin_local;
  
  if ((outMax < -1.0) || (1.0 < outMin)) {
    outMax_local._3_1_ = false;
  }
  else {
    fVar1 = deFloatMax(outMin,-1.0);
    fVar1 = deFloatTan(fVar1);
    *inMin = fVar1;
    fVar1 = deFloatMin(outMax,1.0);
    fVar1 = deFloatTan(fVar1);
    *inMax = fVar1;
    outMax_local._3_1_ = true;
  }
  return outMax_local._3_1_;
}

Assistant:

static inline bool transformValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		// \note For accuracy reasons output range is limited to -1..1
		const float rangeMin = -1.0f;
		const float rangeMax = +1.0f;

		if (outMax < rangeMin || outMin > rangeMax)
			return false; // Out of range

		inMin = deFloatTan(deFloatMax(outMin, rangeMin));
		inMax = deFloatTan(deFloatMin(outMax, rangeMax));

		return true;
	}